

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

longlong __thiscall cmsys::SystemInformation::GetHostMemoryTotal(SystemInformation *this)

{
  int iVar1;
  longlong values [1];
  char *fieldNames [2];
  ulong local_30;
  char *local_28;
  undefined8 local_20;
  
  local_28 = "MemTotal:";
  local_20 = 0;
  local_30 = 0;
  iVar1 = anon_unknown_3::GetFieldsFromFile<long_long>
                    ("/proc/meminfo",&local_28,(longlong *)&local_30);
  return -(ulong)(iVar1 != 0) | local_30;
}

Assistant:

int GetFieldFromFile(const char* fileName, const char* fieldName, T& value)
{
  const char* fieldNames[2] = { fieldName, nullptr };
  T values[1] = { T(0) };
  int ierr = GetFieldsFromFile(fileName, fieldNames, values);
  if (ierr) {
    return ierr;
  }
  value = values[0];
  return 0;
}